

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::AllocateMemoryOfType
          (VmaAllocator_T *this,VmaPool pool,VkDeviceSize size,VkDeviceSize alignment,
          bool dedicatedPreferred,VkBuffer dedicatedBuffer,VkImage dedicatedImage,
          VkFlags dedicatedBufferImageUsage,VmaAllocationCreateInfo *createInfo,
          uint32_t memTypeIndex,VmaSuballocationType suballocType,
          VmaDedicatedAllocationList *dedicatedAllocations,VmaBlockVector *blockVector,
          size_t allocationCount,VmaAllocation *pAllocations)

{
  byte bVar1;
  bool bVar2;
  VkResult VVar3;
  VkDeviceSize VVar4;
  VmaPool in_RDX;
  VkDeviceSize in_RSI;
  long in_RDI;
  byte in_R8B;
  VmaAllocation *in_R9;
  size_t in_stack_00000008;
  void *in_stack_00000018;
  VmaAllocator_T *in_stack_00000030;
  VmaBlockVector *in_stack_00000038;
  VmaDedicatedAllocationList *in_stack_00000040;
  VmaAllocationCreateInfo *in_stack_00000048;
  bool canAllocateDedicated;
  VkResult res;
  VmaAllocationCreateInfo finalCreateInfo;
  memory_order __b;
  size_t in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  VmaSuballocationType in_stack_fffffffffffffe34;
  VmaDedicatedAllocationList *in_stack_fffffffffffffe38;
  VmaAllocationCreateInfo *in_stack_fffffffffffffe40;
  VmaAllocator_T *in_stack_fffffffffffffe48;
  VmaBlockVector *in_stack_fffffffffffffe50;
  VmaAllocation *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffef0;
  float priority;
  undefined1 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffef9;
  undefined1 in_stack_fffffffffffffefa;
  undefined1 in_stack_fffffffffffffefb;
  uint32_t in_stack_fffffffffffffefc;
  uint uVar5;
  VmaDedicatedAllocationList *in_stack_ffffffffffffff00;
  VmaSuballocationType in_stack_ffffffffffffff0c;
  VmaSuballocationType suballocType_00;
  VkDeviceSize in_stack_ffffffffffffff10;
  VmaPool in_stack_ffffffffffffff18;
  VmaAllocator_T *in_stack_ffffffffffffff20;
  VkResult local_ac;
  uint local_a8 [2];
  void *in_stack_ffffffffffffff60;
  VkBuffer in_stack_ffffffffffffff68;
  VkImage in_stack_ffffffffffffff70;
  VkFlags in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff90;
  VkResult local_48;
  
  priority = (float)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  bVar1 = in_R8B & 1;
  memcpy(local_a8,in_stack_00000018,0x30);
  local_48 = CalcMemTypeParams(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                               (uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               in_stack_fffffffffffffe28);
  if (local_48 == VK_SUCCESS) {
    if ((local_a8[0] & 1) == 0) {
      in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
      if ((local_a8[0] & 2) == 0) {
        uVar5 = (uint)CONCAT12(1,(short)in_stack_fffffffffffffefc);
        if (in_RSI != 0) {
          bVar2 = VmaBlockVector::HasExplicitBlockSize(in_stack_00000038);
          uVar5 = (uint)(uint3)(CONCAT12(bVar2,(short)uVar5) ^ 0xff0000);
        }
        in_stack_fffffffffffffefc = CONCAT13((char)(uVar5 >> 0x10),(int3)uVar5);
      }
      uVar5 = in_stack_fffffffffffffefc & 0x1000000;
      if ((in_stack_fffffffffffffefc & 0x1000000) != 0) {
        VVar4 = VmaBlockVector::GetPreferredBlockSize(in_stack_00000038);
        if ((VmaPool)(VVar4 >> 1) < in_RDX) {
          bVar1 = 1;
        }
        std::operator&(memory_order_seq_cst,__memory_order_mask);
        priority = (float)((ulong)in_RDX >> 0x20);
        if ((uint)(*(int *)(in_RDI + 0x21c) * 3) >> 2 < *(uint *)(in_RDI + 0x1550)) {
          bVar1 = 0;
        }
        if ((bVar1 & 1) != 0) {
          in_stack_fffffffffffffe48 =
               (VmaAllocator_T *)VmaBlockVector::GetAllocationNextPtr(in_stack_00000038);
          VVar3 = AllocateDedicatedMemory
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                             in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                             (bool)in_stack_fffffffffffffefb,(bool)in_stack_fffffffffffffefa,
                             (bool)in_stack_fffffffffffffef9,(bool)in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff60,priority,in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_R9,
                             (void *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
          in_stack_fffffffffffffe28 = in_stack_00000008;
          in_stack_fffffffffffffe38 = in_stack_00000040;
          in_stack_fffffffffffffe40 = in_stack_00000048;
          if (VVar3 == VK_SUCCESS) {
            return VK_SUCCESS;
          }
        }
      }
      local_ac = VmaBlockVector::Allocate
                           (in_stack_fffffffffffffe50,(VkDeviceSize)in_stack_fffffffffffffe48,
                            (VkDeviceSize)in_stack_fffffffffffffe40,
                            (VmaAllocationCreateInfo *)in_stack_fffffffffffffe38,
                            in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe60);
      if (local_ac == VK_SUCCESS) {
        local_48 = VK_SUCCESS;
      }
      else {
        if ((uVar5 != 0) && ((bVar1 & 1) == 0)) {
          VmaBlockVector::GetAllocationNextPtr(in_stack_00000038);
          local_ac = AllocateDedicatedMemory
                               (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                                (bool)in_stack_fffffffffffffefb,(bool)in_stack_fffffffffffffefa,
                                (bool)in_stack_fffffffffffffef9,(bool)in_stack_fffffffffffffef8,
                                in_stack_ffffffffffffff60,priority,in_stack_ffffffffffffff68,
                                in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_R9,
                                (void *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
          if (local_ac == VK_SUCCESS) {
            return VK_SUCCESS;
          }
        }
        local_48 = local_ac;
      }
    }
    else {
      suballocType_00 =
           CONCAT13((local_a8[0] & 4) != 0,
                    CONCAT12((local_a8[0] & 0x20) != 0,(short)in_stack_ffffffffffffff0c));
      VmaBlockVector::GetAllocationNextPtr(in_stack_00000038);
      local_48 = AllocateDedicatedMemory
                           (in_stack_00000030,in_RDX,in_RSI,suballocType_00,in_stack_00000040,
                            in_stack_fffffffffffffefc,(bool)in_stack_fffffffffffffefb,
                            (bool)in_stack_fffffffffffffefa,(bool)in_stack_fffffffffffffef9,
                            (bool)in_stack_fffffffffffffef8,in_stack_ffffffffffffff60,priority,
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_R9,
                            (void *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
    }
  }
  return local_48;
}

Assistant:

VkResult VmaAllocator_T::AllocateMemoryOfType(
    VmaPool pool,
    VkDeviceSize size,
    VkDeviceSize alignment,
    bool dedicatedPreferred,
    VkBuffer dedicatedBuffer,
    VkImage dedicatedImage,
    VkFlags dedicatedBufferImageUsage,
    const VmaAllocationCreateInfo& createInfo,
    uint32_t memTypeIndex,
    VmaSuballocationType suballocType,
    VmaDedicatedAllocationList& dedicatedAllocations,
    VmaBlockVector& blockVector,
    size_t allocationCount,
    VmaAllocation* pAllocations)
{
    VMA_ASSERT(pAllocations != VMA_NULL);
    VMA_DEBUG_LOG("  AllocateMemory: MemoryTypeIndex=%u, AllocationCount=%zu, Size=%llu", memTypeIndex, allocationCount, size);

    VmaAllocationCreateInfo finalCreateInfo = createInfo;
    VkResult res = CalcMemTypeParams(
        finalCreateInfo,
        memTypeIndex,
        size,
        allocationCount);
    if(res != VK_SUCCESS)
        return res;

    if((finalCreateInfo.flags & VMA_ALLOCATION_CREATE_DEDICATED_MEMORY_BIT) != 0)
    {
        return AllocateDedicatedMemory(
            pool,
            size,
            suballocType,
            dedicatedAllocations,
            memTypeIndex,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
            (finalCreateInfo.flags &
                (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
            finalCreateInfo.pUserData,
            finalCreateInfo.priority,
            dedicatedBuffer,
            dedicatedImage,
            dedicatedBufferImageUsage,
            allocationCount,
            pAllocations,
            blockVector.GetAllocationNextPtr());
    }
    else
    {
        const bool canAllocateDedicated =
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_NEVER_ALLOCATE_BIT) == 0 &&
            (pool == VK_NULL_HANDLE || !blockVector.HasExplicitBlockSize());

        if(canAllocateDedicated)
        {
            // Heuristics: Allocate dedicated memory if requested size if greater than half of preferred block size.
            if(size > blockVector.GetPreferredBlockSize() / 2)
            {
                dedicatedPreferred = true;
            }
            // Protection against creating each allocation as dedicated when we reach or exceed heap size/budget,
            // which can quickly deplete maxMemoryAllocationCount: Don't prefer dedicated allocations when above
            // 3/4 of the maximum allocation count.
            if(m_DeviceMemoryCount.load() > m_PhysicalDeviceProperties.limits.maxMemoryAllocationCount * 3 / 4)
            {
                dedicatedPreferred = false;
            }

            if(dedicatedPreferred)
            {
                res = AllocateDedicatedMemory(
                    pool,
                    size,
                    suballocType,
                    dedicatedAllocations,
                    memTypeIndex,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
                    (finalCreateInfo.flags &
                        (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
                    finalCreateInfo.pUserData,
                    finalCreateInfo.priority,
                    dedicatedBuffer,
                    dedicatedImage,
                    dedicatedBufferImageUsage,
                    allocationCount,
                    pAllocations,
                    blockVector.GetAllocationNextPtr());
                if(res == VK_SUCCESS)
                {
                    // Succeeded: AllocateDedicatedMemory function already filld pMemory, nothing more to do here.
                    VMA_DEBUG_LOG("    Allocated as DedicatedMemory");
                    return VK_SUCCESS;
                }
            }
        }

        res = blockVector.Allocate(
            size,
            alignment,
            finalCreateInfo,
            suballocType,
            allocationCount,
            pAllocations);
        if(res == VK_SUCCESS)
            return VK_SUCCESS;

        // Try dedicated memory.
        if(canAllocateDedicated && !dedicatedPreferred)
        {
            res = AllocateDedicatedMemory(
                pool,
                size,
                suballocType,
                dedicatedAllocations,
                memTypeIndex,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
                (finalCreateInfo.flags &
                    (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
                finalCreateInfo.pUserData,
                finalCreateInfo.priority,
                dedicatedBuffer,
                dedicatedImage,
                dedicatedBufferImageUsage,
                allocationCount,
                pAllocations,
                blockVector.GetAllocationNextPtr());
            if(res == VK_SUCCESS)
            {
                // Succeeded: AllocateDedicatedMemory function already filld pMemory, nothing more to do here.
                VMA_DEBUG_LOG("    Allocated as DedicatedMemory");
                return VK_SUCCESS;
            }
        }
        // Everything failed: Return error code.
        VMA_DEBUG_LOG("    vkAllocateMemory FAILED");
        return res;
    }
}